

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     PrintWithFallback<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
               (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *value,
               ostream *os)

{
  ostream *os_local;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *value_local;
  
  ContainerPrinter::
  PrintValue<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>,void>(value,os);
  return;
}

Assistant:

void PrintWithFallback(const T& value, ::std::ostream* os) {
  using Printer = typename FindFirstPrinter<
      T, void, ContainerPrinter, FunctionPointerPrinter, PointerPrinter,
      ProtobufPrinter,
#ifdef GTEST_HAS_ABSL
      ConvertibleToAbslStringifyPrinter,
#endif  // GTEST_HAS_ABSL
      internal_stream_operator_without_lexical_name_lookup::StreamPrinter,
      ConvertibleToIntegerPrinter, ConvertibleToStringViewPrinter,
      RawBytesPrinter, FallbackPrinter>::type;
  Printer::PrintValue(value, os);
}